

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# collationsettings.h
# Opt level: O0

void __thiscall icu_63::CollationSettings::CollationSettings(CollationSettings *this)

{
  CollationSettings *this_local;
  
  SharedObject::SharedObject(&this->super_SharedObject);
  (this->super_SharedObject).super_UObject._vptr_UObject =
       (_func_int **)&PTR__CollationSettings_004acb08;
  this->options = 0x2010;
  this->variableTop = 0;
  this->reorderTable = (uint8_t *)0x0;
  this->minHighNoReorder = 0;
  this->reorderRanges = (uint32_t *)0x0;
  this->reorderRangesLength = 0;
  this->reorderCodes = (int32_t *)0x0;
  this->reorderCodesLength = 0;
  this->reorderCodesCapacity = 0;
  this->fastLatinOptions = -1;
  return;
}

Assistant:

CollationSettings()
            : options((UCOL_DEFAULT_STRENGTH << STRENGTH_SHIFT) |
                      (MAX_VAR_PUNCT << MAX_VARIABLE_SHIFT)),
              variableTop(0),
              reorderTable(NULL),
              minHighNoReorder(0),
              reorderRanges(NULL), reorderRangesLength(0),
              reorderCodes(NULL), reorderCodesLength(0), reorderCodesCapacity(0),
              fastLatinOptions(-1) {}